

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O1

void __thiscall LinkedObjectFile::disassemble_functions(LinkedObjectFile *this)

{
  uint32_t *puVar1;
  pointer pvVar2;
  pointer pFVar3;
  pointer pvVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pFVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  Instruction local_100;
  
  if (0 < this->segments) {
    uVar10 = 0;
    do {
      pvVar2 = (this->functions_by_seg).
               super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->functions_by_seg).
                     super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555;
      uVar11 = uVar10;
      if (uVar6 < uVar10 || uVar6 - uVar10 == 0) {
LAB_0012fbba:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar11);
      }
      pFVar3 = *(pointer *)
                ((long)&pvVar2[uVar10].super__Vector_base<Function,_std::allocator<Function>_>.
                        _M_impl.super__Vector_impl_data + 8);
      for (pFVar8 = pvVar2[uVar10].super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
                    super__Vector_impl_data._M_start; pFVar8 != pFVar3; pFVar8 = pFVar8 + 1) {
        uVar6 = (ulong)pFVar8->start_word;
        if (pFVar8->start_word < pFVar8->end_word) {
          do {
            pvVar4 = (this->words_by_seg).
                     super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar7 = ((long)(this->words_by_seg).
                           super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                    -0x5555555555555555;
            uVar11 = uVar10;
            if ((uVar7 < uVar10 || uVar7 - uVar10 == 0) ||
               (lVar12 = *(long *)&pvVar4[uVar10].
                                   super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                   _M_impl.super__Vector_impl_data,
               uVar7 = ((long)*(pointer *)
                               ((long)&pvVar4[uVar10].
                                       super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                       _M_impl.super__Vector_impl_data + 8) - lVar12 >> 4) *
                       -0x5555555555555555, uVar11 = uVar6, uVar7 < uVar6 || uVar7 - uVar6 == 0))
            goto LAB_0012fbba;
            decode_instruction(&local_100,(LinkedWord *)(lVar12 + uVar6 * 0x30),this,(int)uVar10,
                               (int)uVar6);
            std::vector<Instruction,_std::allocator<Instruction>_>::emplace_back<Instruction>
                      (&pFVar8->instructions,&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100.dst[0].sym._M_dataplus._M_p != &local_100.dst[0].sym.field_2) {
              operator_delete(local_100.dst[0].sym._M_dataplus._M_p,
                              local_100.dst[0].sym.field_2._M_allocated_capacity + 1);
            }
            lVar12 = -0x90;
            paVar9 = &local_100.src[2].sym.field_2;
            do {
              if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(&paVar9->_M_allocated_capacity)[-2]) {
                operator_delete((long *)(&paVar9->_M_allocated_capacity)[-2],
                                paVar9->_M_allocated_capacity + 1);
              }
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(&paVar9->_M_allocated_capacity + -6);
              lVar12 = lVar12 + 0x30;
            } while (lVar12 != 0);
            bVar5 = Instruction::is_valid
                              (*(pointer *)
                                ((long)&(pFVar8->instructions).
                                        super__Vector_base<Instruction,_std::allocator<Instruction>_>
                                        ._M_impl + 8) + -1);
            if (bVar5) {
              puVar1 = &(this->stats).decoded_ops;
              *puVar1 = *puVar1 + 1;
            }
            uVar6 = uVar6 + 1;
          } while ((long)uVar6 < (long)pFVar8->end_word);
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)this->segments);
  }
  return;
}

Assistant:

void LinkedObjectFile::disassemble_functions() {
  for (int seg = 0; seg < segments; seg++) {
    for (auto& function : functions_by_seg.at(seg)) {
      for (auto word = function.start_word; word < function.end_word; word++) {
        // decode!
        function.instructions.push_back(
            decode_instruction(words_by_seg.at(seg).at(word), *this, seg, word));
        if (function.instructions.back().is_valid()) {
          stats.decoded_ops++;
        }
      }
    }
  }
}